

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O3

void __thiscall
utObjImportExport_no_vt_just_vns_Test::TestBody(utObjImportExport_no_vt_just_vns_Test *this)

{
  bool bVar1;
  char *message;
  Importer myImporter;
  AssertionResult gtest_ar;
  aiScene *scene;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  AssertHelper local_38;
  Importer local_30;
  internal local_28 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  aiScene *local_18;
  
  Assimp::Importer::Importer(&local_30);
  message = "";
  local_18 = Assimp::Importer::ReadFileFromMemory
                       (&local_30,
                        "v 0 0 0\nv 0 0 0\nv 0 0 0\nv 0 0 0\nv 0 0 0\nv 0 0 0\nv 0 0 0\nv 0 0 0\nv 0 0 0\nv 0 0 0\nv 10 0 0\nv 0 10 0\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nvn 0 0 1\nf 10/10 11/11 12/12\n"
                        ,0xe2,0,"");
  local_40.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            (local_28,"nullptr","scene",&local_40.ptr_,&local_18);
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_40);
    if (local_20.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utObjImportExport.cpp"
               ,0x1a8,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_40.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_40.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_40.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  Assimp::Importer::~Importer(&local_30);
  return;
}

Assistant:

TEST_F(utObjImportExport, no_vt_just_vns) {
    static const char *ObjModel =
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 0 0 0\n"
		"v 10 0 0\n"
		"v 0 10 0\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"vn 0 0 1\n"
		"f 10/10 11/11 12/12\n";

    Assimp::Importer myImporter;
    const aiScene *scene = myImporter.ReadFileFromMemory(ObjModel, strlen(ObjModel), 0);
    EXPECT_NE(nullptr, scene);
}